

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O3

LY_ERR yin_parse_refine(lysp_yin_ctx *ctx,lysp_refine **refines)

{
  lysp_refine *plVar1;
  lysp_ext_instance *object;
  LY_ERR LVar2;
  long *plVar3;
  long lVar4;
  char **arg_val;
  yin_subelement subelems [11];
  yin_subelement local_138;
  undefined4 local_120;
  long *local_118;
  undefined2 local_110;
  undefined4 local_108;
  long *local_100;
  undefined2 local_f8;
  undefined4 local_f0;
  long *local_e8;
  undefined2 local_e0;
  undefined4 local_d8;
  long *local_d0;
  undefined2 local_c8;
  undefined4 local_c0;
  char **local_b8;
  undefined2 local_b0;
  undefined4 local_a8;
  char **local_a0;
  undefined2 local_98;
  undefined4 local_90;
  long *local_88;
  undefined2 local_80;
  undefined4 local_78;
  long *local_70;
  undefined2 local_68;
  undefined4 local_60;
  long *local_58;
  undefined2 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  plVar1 = *refines;
  if (plVar1 == (lysp_refine *)0x0) {
    plVar3 = (long *)malloc(0x58);
    if (plVar3 == (long *)0x0) goto LAB_001879eb;
    *plVar3 = 1;
    lVar4 = 1;
  }
  else {
    lVar4 = *(long *)&plVar1[-1].flags;
    *(long *)&plVar1[-1].flags = lVar4 + 1;
    plVar3 = (long *)realloc(&plVar1[-1].flags,lVar4 * 0x50 + 0x58);
    if (plVar3 == (long *)0x0) {
      *(long *)&(*refines)[-1].flags = *(long *)&(*refines)[-1].flags + -1;
LAB_001879eb:
      ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_refine"
            );
      return LY_EMEM;
    }
    lVar4 = *plVar3;
  }
  *refines = (lysp_refine *)(plVar3 + 1);
  plVar3[lVar4 * 10 + -1] = 0;
  (plVar3 + lVar4 * 10 + -1)[1] = 0;
  plVar3[lVar4 * 10 + -3] = 0;
  (plVar3 + lVar4 * 10 + -3)[1] = 0;
  plVar3[lVar4 * 10 + -5] = 0;
  (plVar3 + lVar4 * 10 + -5)[1] = 0;
  plVar3[lVar4 * 10 + -7] = 0;
  (plVar3 + lVar4 * 10 + -7)[1] = 0;
  plVar3[lVar4 * 10 + -9] = 0;
  (plVar3 + lVar4 * 10 + -9)[1] = 0;
  LVar2 = lyxml_ctx_next(ctx->xmlctx);
  if (LVar2 == LY_SUCCESS) {
    arg_val = (char **)(plVar3 + lVar4 * 10 + -9);
    LVar2 = yin_parse_attribute(ctx,YIN_ARG_TARGET_NODE,arg_val,Y_STR_ARG,LY_STMT_REFINE);
    if (LVar2 == LY_SUCCESS) {
      plVar3 = plVar3 + lVar4 * 10;
      if (**arg_val == '\0') {
        ly_log((ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
               LY_LLWRN,LY_SUCCESS,"Empty argument of %s statement does not make sense.","refine");
      }
      local_138.type = LY_STMT_CONFIG;
      local_138.flags = 2;
      local_120 = 0x70000;
      local_118 = plVar3 + -3;
      local_110 = 0;
      local_108 = 0x80000;
      local_100 = plVar3 + -8;
      local_f8 = 2;
      local_f0 = 0x130000;
      local_e8 = plVar3 + -6;
      local_e0 = 0;
      local_d8 = 0x180000;
      local_c8 = 2;
      local_c0 = 0x190000;
      local_b0 = 2;
      local_a8 = 0x1a0000;
      local_98 = 2;
      local_90 = 0x1d0000;
      local_88 = plVar3 + -5;
      local_80 = 0;
      local_78 = 0x250000;
      local_70 = plVar3 + -4;
      local_68 = 2;
      local_60 = 0x270000;
      local_58 = plVar3 + -7;
      local_50 = 2;
      uStack_40 = 0;
      local_38 = 0;
      local_48 = 0xf0000;
      local_138.dest = plVar3;
      local_d0 = plVar3;
      local_b8 = arg_val;
      local_a0 = arg_val;
      LVar2 = yin_parse_content(ctx,&local_138,0xb,arg_val,LY_STMT_REFINE,(char **)0x0,
                                (lysp_ext_instance **)(plVar3 + -1));
      if (LVar2 == LY_SUCCESS) {
        object = (lysp_ext_instance *)plVar3[-1];
        if (object != (lysp_ext_instance *)0x0) {
          LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,object,'\x01',(uint32_t *)0x0);
          if (LVar2 != LY_SUCCESS) {
            return LVar2 + (LVar2 == LY_SUCCESS);
          }
        }
        LVar2 = LY_SUCCESS;
      }
    }
  }
  return LVar2;
}

Assistant:

static LY_ERR
yin_parse_refine(struct lysp_yin_ctx *ctx, struct lysp_refine **refines)
{
    struct lysp_refine *rf;

    /* allocate new refine */
    LY_ARRAY_NEW_RET(ctx->xmlctx->ctx, *refines, rf, LY_EMEM);

    /* parse attribute */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_TARGET_NODE, &rf->nodeid, Y_STR_ARG, LY_STMT_REFINE));
    CHECK_NONEMPTY(ctx, strlen(rf->nodeid), "refine");

    /* parse content */
    struct yin_subelement subelems[] = {
        {LY_STMT_CONFIG, &rf->flags, YIN_SUBELEM_UNIQUE},
        {LY_STMT_DEFAULT, &rf->dflts, 0},
        {LY_STMT_DESCRIPTION, &rf->dsc, YIN_SUBELEM_UNIQUE},
        {LY_STMT_IF_FEATURE, &rf->iffeatures, 0},
        {LY_STMT_MANDATORY, &rf->flags, YIN_SUBELEM_UNIQUE},
        {LY_STMT_MAX_ELEMENTS, rf, YIN_SUBELEM_UNIQUE},
        {LY_STMT_MIN_ELEMENTS, rf, YIN_SUBELEM_UNIQUE},
        {LY_STMT_MUST, &rf->musts, 0},
        {LY_STMT_PRESENCE, &rf->presence, YIN_SUBELEM_UNIQUE},
        {LY_STMT_REFERENCE, &rf->ref, YIN_SUBELEM_UNIQUE},
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
    };

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), rf, LY_STMT_REFINE, NULL, &rf->exts));

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, rf->exts));

    return LY_SUCCESS;
}